

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lista.hpp
# Opt level: O0

Lista<int> * __thiscall Lista<int>::operator=(Lista<int> *this,Lista<int> *aCopiar)

{
  int *piVar1;
  int local_24;
  int local_20;
  int iesimo;
  int i;
  int longitud;
  Lista<int> *aCopiar_local;
  Lista<int> *this_local;
  
  _i = aCopiar;
  aCopiar_local = this;
  eliminarTodos(this);
  iesimo = Lista<int>::longitud(_i);
  for (local_20 = 0; local_20 < iesimo; local_20 = local_20 + 1) {
    piVar1 = Lista<int>::iesimo(_i,(long)local_20);
    local_24 = *piVar1;
    agregarAtras(this,&local_24);
  }
  return this;
}

Assistant:

Lista<T>& Lista<T>::operator=(const Lista<T>& aCopiar) {
    this->eliminarTodos();
    int longitud = aCopiar.longitud();
    for(int i = 0; i < longitud; i++) {
        T iesimo = aCopiar.iesimo(i);
        this->agregarAtras(iesimo);
    }
    return *this;
}